

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench.cc
# Opt level: O0

void __thiscall leveldb::Benchmark::DoDelete(Benchmark *this,ThreadState *thread,bool seq)

{
  FILE *__stream;
  bool bVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  uint local_12c;
  Status local_120 [4];
  Status local_100;
  Slice local_f8;
  char local_e8 [8];
  char key [100];
  int local_78;
  int k;
  int j;
  int i;
  Status s;
  WriteBatch batch;
  RandomGenerator gen;
  bool seq_local;
  ThreadState *thread_local;
  Benchmark *this_local;
  
  anon_unknown_0::RandomGenerator::RandomGenerator((RandomGenerator *)&batch.field_0x18);
  WriteBatch::WriteBatch((WriteBatch *)&s);
  Status::Status((Status *)&j);
  k = 0;
  while( true ) {
    if (this->num_ <= k) {
      Status::~Status((Status *)&j);
      WriteBatch::~WriteBatch((WriteBatch *)&s);
      anon_unknown_0::RandomGenerator::~RandomGenerator((RandomGenerator *)&batch.field_0x18);
      return;
    }
    WriteBatch::Clear((WriteBatch *)&s);
    for (local_78 = 0; local_78 < this->entries_per_batch_; local_78 = local_78 + 1) {
      if (seq) {
        local_12c = k + local_78;
      }
      else {
        uVar2 = Random::Next(&thread->rand);
        local_12c = uVar2 % (uint)FLAGS_num;
      }
      snprintf(local_e8,100,"%016d",(ulong)local_12c);
      Slice::Slice(&local_f8,local_e8);
      WriteBatch::Delete((WriteBatch *)&s,&local_f8);
      anon_unknown_0::Stats::FinishedSingleOp(&thread->stats);
    }
    (*this->db_->_vptr_DB[4])(&local_100,this->db_,&this->write_options_,&s);
    Status::operator=((Status *)&j,&local_100);
    Status::~Status(&local_100);
    bVar1 = Status::ok((Status *)&j);
    __stream = _stderr;
    if (!bVar1) break;
    k = this->entries_per_batch_ + k;
  }
  Status::ToString_abi_cxx11_(local_120);
  uVar3 = std::__cxx11::string::c_str();
  fprintf(__stream,"del error: %s\n",uVar3);
  std::__cxx11::string::~string((string *)local_120);
  exit(1);
}

Assistant:

void DoDelete(ThreadState* thread, bool seq) {
    RandomGenerator gen;
    WriteBatch batch;
    Status s;
    for (int i = 0; i < num_; i += entries_per_batch_) {
      batch.Clear();
      for (int j = 0; j < entries_per_batch_; j++) {
        const int k = seq ? i + j : (thread->rand.Next() % FLAGS_num);
        char key[100];
        std::snprintf(key, sizeof(key), "%016d", k);
        batch.Delete(key);
        thread->stats.FinishedSingleOp();
      }
      s = db_->Write(write_options_, &batch);
      if (!s.ok()) {
        std::fprintf(stderr, "del error: %s\n", s.ToString().c_str());
        std::exit(1);
      }
    }
  }